

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O2

void __thiscall
google::protobuf::UnknownFieldSet::SwapSlow(UnknownFieldSet *this,UnknownFieldSet *other)

{
  UnknownFieldSet tmp;
  anon_union_16_2_b9f6da03_for_SooRep_0 local_28;
  
  local_28.long_rep.elements_int = 0;
  local_28.short_rep.field_1 = (anon_union_8_2_4f9aec01_for_ShortSooRep_1)0x0;
  MergeFrom((UnknownFieldSet *)&local_28.long_rep,this);
  Clear(this);
  MergeFrom(this,other);
  Clear(other);
  MergeFrom(other,(UnknownFieldSet *)&local_28.long_rep);
  ~UnknownFieldSet((UnknownFieldSet *)&local_28.long_rep);
  return;
}

Assistant:

void UnknownFieldSet::SwapSlow(UnknownFieldSet* other) {
  UnknownFieldSet tmp;
  tmp.MergeFrom(*this);
  this->Clear();
  this->MergeFrom(*other);
  other->Clear();
  other->MergeFrom(tmp);
}